

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderHeatmap<unsigned_int,ImPlot::TransformerLinLin>
               (TransformerLinLin transformer,ImDrawList *DrawList,uint *values,int rows,int cols,
               double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max)

{
  ImPlotPlot *pIVar1;
  ImVec2 IVar2;
  ImPlotContext *pIVar3;
  uint *puVar4;
  ImU32 col;
  ImPlotContext *gp;
  int iVar5;
  long lVar6;
  int iVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  ImVec4 IVar18;
  ImVec2 a;
  ImVec2 b;
  ImVec4 color;
  ImVec2 local_e8;
  uint *local_e0;
  ulong local_d8;
  double local_d0;
  double local_c8;
  ImDrawList *local_c0;
  double local_b8;
  double local_b0;
  undefined1 local_a8 [16];
  uint *local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_70;
  char *local_68;
  ImVec2 local_60;
  ImVec4 local_58 [2];
  
  pIVar3 = GImPlot;
  dVar8 = (bounds_max->x - bounds_min->x) / (double)cols;
  dVar9 = (bounds_max->y - bounds_min->y) / (double)rows;
  dVar15 = dVar8 * 0.5;
  dVar17 = scale_max - scale_min;
  local_d8 = (ulong)(uint)cols;
  local_e0 = values;
  local_d0 = dVar15;
  local_c8 = dVar8;
  local_c0 = DrawList;
  local_b8 = scale_min;
  local_b0 = dVar17;
  if (0 < rows) {
    dVar16 = dVar9 * 0.5;
    iVar5 = 0;
    dVar11 = dVar8 * 0.5;
    dVar12 = 0.0;
    iVar7 = 0;
    local_a8._0_8_ = dVar16;
    local_68 = fmt;
    do {
      if (0 < cols) {
        local_88 = dVar9 * dVar12 + dVar9 * 0.5;
        local_98 = local_e0 + iVar5;
        dVar10 = 0.0;
        lVar6 = 0;
        do {
          dVar13 = dVar10 * dVar8 + bounds_min->x + dVar11;
          dVar14 = bounds_max->y - local_88;
          pIVar1 = GImPlot->CurrentPlot;
          dVar8 = (pIVar1->XAxis).Range.Min;
          local_e8.x = (float)(((dVar13 - dVar15) - dVar8) * GImPlot->Mx +
                              (double)GImPlot->PixelRange[transformer.YAxis].Min.x);
          local_e8.y = (float)(((dVar14 - dVar16) - pIVar1->YAxis[transformer.YAxis].Range.Min) *
                               GImPlot->My[transformer.YAxis] +
                              (double)GImPlot->PixelRange[transformer.YAxis].Min.y);
          local_60.x = (float)(((dVar13 + dVar15) - dVar8) * GImPlot->Mx +
                              (double)GImPlot->PixelRange[transformer.YAxis].Min.x);
          local_60.y = (float)(((dVar14 + dVar16) - pIVar1->YAxis[transformer.YAxis].Range.Min) *
                               GImPlot->My[transformer.YAxis] +
                              (double)GImPlot->PixelRange[transformer.YAxis].Min.y);
          IVar18 = LerpColormap((float)(((double)local_98[lVar6] - scale_min) / dVar17 + 0.0));
          local_58[0].w = IVar18.w;
          local_58[0]._0_12_ = IVar18._0_12_;
          local_58[0].w = (pIVar3->Style).FillAlpha * local_58[0].w;
          col = ImGui::GetColorU32(local_58);
          ImDrawList::AddRectFilled(local_c0,&local_e8,&local_60,col,0.0,0xf);
          dVar10 = dVar10 + 1.0;
          lVar6 = lVar6 + 1;
          dVar8 = local_c8;
          dVar15 = local_d0;
          dVar16 = (double)local_a8._0_8_;
          scale_min = local_b8;
          dVar17 = local_b0;
        } while ((int)local_d8 != (int)lVar6);
        iVar5 = iVar5 + (int)lVar6;
        fmt = local_68;
      }
      dVar12 = dVar12 + 1.0;
      iVar7 = iVar7 + 1;
    } while (iVar7 != rows);
  }
  if (0 < rows && fmt != (char *)0x0) {
    local_70 = dVar9 * 0.5;
    iVar5 = 0;
    dVar17 = 0.0;
    iVar7 = 0;
    do {
      puVar4 = local_e0;
      if (0 < cols) {
        dVar11 = dVar9 * dVar17 + local_70;
        dVar16 = 0.0;
        lVar6 = 0;
        do {
          dVar8 = ((dVar16 * dVar8 + bounds_min->x + dVar15) -
                  (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                  (double)GImPlot->PixelRange[transformer.YAxis].Min.x;
          local_88 = (double)CONCAT44((int)((ulong)dVar8 >> 0x20),(float)dVar8);
          uStack_80 = 0;
          dVar8 = (((bounds_min->y + 1.0) - dVar11) -
                  GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min) *
                  GImPlot->My[transformer.YAxis] +
                  (double)GImPlot->PixelRange[transformer.YAxis].Min.y;
          local_98 = (uint *)CONCAT44((int)((ulong)dVar8 >> 0x20),(float)dVar8);
          uStack_90 = 0;
          sprintf((char *)local_58,fmt,(ulong)puVar4[iVar5 + lVar6]);
          IVar2 = ImGui::CalcTextSize((char *)local_58,(char *)0x0,false,-1.0);
          local_a8._8_4_ = extraout_XMM0_Dc;
          local_a8._0_4_ = IVar2.x;
          local_a8._4_4_ = IVar2.y;
          local_a8._12_4_ = extraout_XMM0_Dd;
          IVar18 = LerpColormap((float)(((double)puVar4[iVar5 + lVar6] - local_b8) / local_b0 + 0.0)
                               );
          local_e8.y = local_98._0_4_ - (float)local_a8._4_4_ * 0.5;
          local_e8.x = local_88._0_4_ - (float)local_a8._0_4_ * 0.5;
          ImDrawList::AddText(local_c0,&local_e8,
                              -(uint)(IVar18.z * 0.114 + IVar18.x * 0.299 + IVar18.y * 0.587 <= 0.5)
                              | 0xff000000,(char *)local_58,(char *)0x0);
          dVar16 = dVar16 + 1.0;
          lVar6 = lVar6 + 1;
          dVar8 = local_c8;
          dVar15 = local_d0;
        } while ((int)local_d8 != (int)lVar6);
        iVar5 = iVar5 + (int)lVar6;
      }
      dVar17 = dVar17 + 1.0;
      iVar7 = iVar7 + 1;
    } while (iVar7 != rows);
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max) {
    ImPlotContext& gp = *GImPlot;
    const double w = (bounds_max.x - bounds_min.x) / cols;
    const double h = (bounds_max.y - bounds_min.y) / rows;
    const ImPlotPoint half_size(w*0.5,h*0.5);
    int i = 0;
    for (int r = 0; r < rows; ++r) {
        for (int c = 0; c < cols; ++c) {
            ImPlotPoint p;
            p.x = bounds_min.x + 0.5*w + c*w;
            p.y = bounds_max.y - (0.5*h + r*h);
            ImVec2 a  = transformer(ImPlotPoint(p.x - half_size.x, p.y - half_size.y));
            ImVec2 b  = transformer(ImPlotPoint(p.x + half_size.x, p.y + half_size.y));
            double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
            ImVec4 color = LerpColormap((float)t);
            color.w *= gp.Style.FillAlpha;
            ImU32 col = ImGui::GetColorU32(color);
            DrawList.AddRectFilled(a, b, col);
            i++;
        }
    }
    if (fmt != NULL) {
        i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = bounds_min.y + 1 - (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
                ImVec4 color = LerpColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}